

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O0

void __thiscall
booster::locale::boundary::details::
segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
::set(segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      *this,base_iterator p)

{
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  __first;
  bool bVar1;
  pointer pbVar2;
  size_t sVar3;
  base_iterator __i;
  segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *this_00;
  int __c;
  int __c_00;
  char *in_RSI;
  break_info *in_RDI;
  const_iterator boundary_point;
  const_iterator e;
  const_iterator b;
  size_t dist;
  vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  *in_stack_ffffffffffffff68;
  __normal_iterator<const_booster::locale::boundary::break_info_*,_std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
  *in_stack_ffffffffffffff70;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  in_stack_ffffffffffffff78;
  segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *this_01;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  undefined1 uVar4;
  __normal_iterator<const_booster::locale::boundary::break_info_*,_std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
  in_stack_ffffffffffffff90;
  __normal_iterator<const_booster::locale::boundary::break_info_*,_std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
  in_stack_ffffffffffffff98;
  break_info local_60;
  break_info *local_50;
  break_info *local_48;
  __normal_iterator<const_booster::locale::boundary::break_info_*,_std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
  local_40;
  break_info *local_38;
  break_info *local_30;
  char *local_28;
  wchar_t *local_20;
  size_t local_18;
  char *local_8;
  
  local_8 = in_RSI;
  local_20 = (wchar_t *)
             mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             ::begin(*(mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                       **)&in_RDI[2].rule);
  local_28 = local_8;
  __first._M_current._7_1_ = in_stack_ffffffffffffff87;
  __first._M_current._0_7_ = in_stack_ffffffffffffff80;
  local_18 = std::distance<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
                       (__first,in_stack_ffffffffffffff78);
  mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::index(*(mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            **)&in_RDI[2].rule,local_8,__c);
  local_30 = (break_info *)
             std::
             vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
             ::begin(in_stack_ffffffffffffff68);
  mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::index(*(mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            **)&in_RDI[2].rule,local_8,__c_00);
  local_50 = (break_info *)
             std::
             vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
             ::end(in_stack_ffffffffffffff68);
  local_48 = local_30;
  local_38 = local_50;
  break_info::break_info(&local_60,local_18);
  local_40 = std::
             upper_bound<__gnu_cxx::__normal_iterator<booster::locale::boundary::break_info_const*,std::vector<booster::locale::boundary::break_info,std::allocator<booster::locale::boundary::break_info>>>,booster::locale::boundary::break_info>
                       (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff70,
                       (__normal_iterator<const_booster::locale::boundary::break_info_*,_std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
                        *)in_stack_ffffffffffffff68);
    uVar4 = false;
    if (bVar1) {
      pbVar2 = __gnu_cxx::
               __normal_iterator<const_booster::locale::boundary::break_info_*,_std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
               ::operator->(&local_40);
      uVar4 = (pbVar2->rule & (uint)in_RDI[3].offset) == 0;
    }
    if ((bool)uVar4 == false) break;
    __gnu_cxx::
    __normal_iterator<const_booster::locale::boundary::break_info_*,_std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
    ::operator++((__normal_iterator<const_booster::locale::boundary::break_info_*,_std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
                  *)in_stack_ffffffffffffff78._M_current,
                 (int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  }
  sVar3 = __gnu_cxx::operator-
                    (in_stack_ffffffffffffff70,
                     (__normal_iterator<const_booster::locale::boundary::break_info_*,_std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
                      *)in_stack_ffffffffffffff68);
  in_RDI[2].offset = sVar3;
  *(size_t *)&in_RDI[1].rule = sVar3;
  if ((in_RDI[3].offset & 0x100000000) == 0) {
    if (*(long *)&in_RDI[1].rule != 0) {
      *(long *)&in_RDI[1].rule = *(long *)&in_RDI[1].rule + -1;
    }
  }
  else {
    do {
      if (*(long *)&in_RDI[1].rule == 0) break;
      *(long *)&in_RDI[1].rule = *(long *)&in_RDI[1].rule + -1;
      bVar1 = valid_offset((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            *)CONCAT17(uVar4,in_stack_ffffffffffffff80),
                           (size_t)in_stack_ffffffffffffff78._M_current);
    } while (!bVar1);
  }
  __i = mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::begin(*(mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                  **)&in_RDI[2].rule);
  in_RDI->offset = (size_t)__i._M_current;
  get_offset((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              *)in_stack_ffffffffffffff78._M_current,(size_t)in_stack_ffffffffffffff70);
  std::advance<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,unsigned_long>
            ((__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
              *)__i._M_current,(unsigned_long)in_RDI);
  *(size_t *)&in_RDI->rule = in_RDI->offset;
  this_01 = (segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)&in_RDI->rule;
  this_00 = (segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)get_offset(this_01,(size_t)in_stack_ffffffffffffff70);
  get_offset(this_01,(size_t)this_00);
  std::advance<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,unsigned_long>
            ((__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
              *)__i._M_current,(unsigned_long)in_RDI);
  update_rule(this_00);
  return;
}

Assistant:

void set(base_iterator p)
                    {
                        size_t dist=std::distance(map_->begin(),p);
                        index_type::const_iterator b=map_->index().begin(),e=map_->index().end();
                        index_type::const_iterator 
                            boundary_point=std::upper_bound(b,e,break_info(dist));
                        while(boundary_point != e && (boundary_point->rule & mask_)==0)
                            boundary_point++;

                        current_.first = current_.second = boundary_point - b;
                        
                        if(full_select_) {
                            while(current_.first > 0) {
                                current_.first --;
                                if(valid_offset(current_.first))
                                    break;
                            }
                        }
                        else {
                            if(current_.first > 0)
                                current_.first --;
                        }
                        value_.first = map_->begin();
                        std::advance(value_.first,get_offset(current_.first));
                        value_.second = value_.first;
                        std::advance(value_.second,get_offset(current_.second) - get_offset(current_.first));

                        update_rule();
                    }